

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

optional_ptr<duckdb::Binding,_true> __thiscall
duckdb::BindContext::GetBinding
          (BindContext *this,BindingAlias *alias,string *column_name,ErrorData *out_error)

{
  Binding *this_00;
  bool bVar1;
  reference pvVar2;
  BinderException *this_01;
  ErrorData *bindings;
  pointer prVar3;
  Binding *pBVar4;
  allocator local_131;
  BindContext *local_130;
  vector<std::reference_wrapper<duckdb::Binding>,_true> matching_bindings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string helper_message;
  
  bindings = out_error;
  local_130 = (BindContext *)alias;
  GetBindings(&matching_bindings,this,alias,out_error);
  if (matching_bindings.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      matching_bindings.
      super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar4 = (Binding *)0x0;
    for (prVar3 = matching_bindings.
                  super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        prVar3 != matching_bindings.
                  super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; prVar3 = prVar3 + 1) {
      this_00 = prVar3->_M_data;
      bVar1 = Binding::HasMatchingBinding(this_00,column_name);
      if ((bVar1) && (bVar1 = pBVar4 != (Binding *)0x0, pBVar4 = this_00, bVar1)) {
        AmbiguityException_abi_cxx11_
                  (&helper_message,local_130,(BindingAlias *)&matching_bindings,
                   (vector<std::reference_wrapper<duckdb::Binding>,_true> *)bindings);
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_d0,"Ambiguous reference to table \"%s\" %s",&local_131);
        BindingAlias::ToString_abi_cxx11_(&local_f0,(BindingAlias *)local_130);
        ::std::__cxx11::string::string((string *)&local_110,(string *)&helper_message);
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  (this_01,&local_d0,&local_f0,&local_110);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if (pBVar4 != (Binding *)0x0) goto LAB_0164c39a;
    pvVar2 = vector<std::reference_wrapper<duckdb::Binding>,_true>::get<true>(&matching_bindings,0);
    (*pvVar2->_M_data->_vptr_Binding[2])(&helper_message,pvVar2->_M_data,column_name);
    ErrorData::operator=(out_error,(ErrorData *)&helper_message);
    ErrorData::~ErrorData((ErrorData *)&helper_message);
  }
  pBVar4 = (Binding *)0x0;
LAB_0164c39a:
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                   *)&matching_bindings);
  return (optional_ptr<duckdb::Binding,_true>)pBVar4;
}

Assistant:

optional_ptr<Binding> BindContext::GetBinding(const BindingAlias &alias, const string &column_name,
                                              ErrorData &out_error) {
	auto matching_bindings = GetBindings(alias, out_error);
	if (matching_bindings.empty()) {
		// no bindings found
		return nullptr;
	}

	optional_ptr<Binding> result;
	// find the binding that this column name belongs to
	for (auto &binding_ref : matching_bindings) {
		auto &binding = binding_ref.get();
		if (!binding.HasMatchingBinding(column_name)) {
			continue;
		}
		if (result) {
			// we found multiple bindings that this column name belongs to - ambiguity
			string helper_message = AmbiguityException(alias, matching_bindings);
			throw BinderException("Ambiguous reference to table \"%s\" %s", alias.ToString(), helper_message);
		} else {
			result = &binding;
		}
	}
	if (!result) {
		// found the table binding - but could not find the column
		out_error = matching_bindings[0].get().ColumnNotFoundError(column_name);
	}
	return result;
}